

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall
google::protobuf::UnknownFieldSet::AddVarint(UnknownFieldSet *this,int number,uint64_t value)

{
  pointer pUVar1;
  
  pUVar1 = RepeatedField<google::protobuf::UnknownField>::Add(&this->fields_);
  pUVar1->number_ = number;
  pUVar1->type_ = 0;
  (pUVar1->data_).varint = value;
  return;
}

Assistant:

void UnknownFieldSet::AddVarint(int number, uint64_t value) {
  auto& field = *fields_.Add();
  field.number_ = number;
  field.SetType(UnknownField::TYPE_VARINT);
  field.data_.varint = value;
}